

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTernaryExpr(BinaryReaderIR *this,Opcode opcode)

{
  unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)44>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)44>_>_>
  local_28;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_20;
  BinaryReaderIR *local_18;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  local_18 = this;
  this_local._0_4_ = opcode.enum_;
  MakeUnique<wabt::OpcodeExpr<(wabt::ExprType)44>,wabt::Opcode&>
            ((wabt *)&local_28,(Opcode *)&this_local);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)44>,std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)44>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_20,&local_28);
  this_local._4_4_ = AppendExpr(this,&local_20);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_20);
  std::
  unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)44>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)44>_>_>
  ::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTernaryExpr(Opcode opcode) {
  return AppendExpr(MakeUnique<TernaryExpr>(opcode));
}